

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  int iVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  char *__function;
  ImGuiWindow *pIVar4;
  
  pIVar3 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar1 = (GImGui->CurrentWindowStack).Size;
  if ((iVar1 < 2) && (GImGui->WithinFrameScopeWithImplicitWindow == true)) {
    __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x18ed,"void ImGui::End()");
  }
  if (iVar1 < 1) {
    __assert_fail("g.CurrentWindowStack.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x18f0,"void ImGui::End()");
  }
  if (((pIVar4->Flags & 0x1000000) != 0) && (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x18f4,"void ImGui::End()");
  }
  if ((pIVar4->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
  }
  PopClipRect();
  if ((pIVar4->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  iVar1 = (pIVar3->CurrentWindowStack).Size;
  if (0 < iVar1) {
    (pIVar3->CurrentWindowStack).Size = iVar1 + -1;
    if ((pIVar4->Flags & 0x4000000) != 0) {
      iVar1 = (pIVar3->BeginPopupStack).Size;
      if (iVar1 < 1) {
        __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
        goto LAB_0014bec9;
      }
      (pIVar3->BeginPopupStack).Size = iVar1 + -1;
    }
    ImGuiStackSizes::CompareWithCurrentState(&(pIVar4->DC).StackSizesOnBegin);
    uVar2 = (pIVar3->CurrentWindowStack).Size;
    if ((ulong)uVar2 == 0) {
      pIVar4 = (ImGuiWindow *)0x0;
    }
    else {
      if ((int)uVar2 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x695,"T &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
      }
      pIVar4 = (pIVar3->CurrentWindowStack).Data[(ulong)uVar2 - 1];
    }
    SetCurrentWindow(pIVar4);
    return;
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_0014bec9:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x6a1,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    window->DC.StackSizesOnBegin.CompareWithCurrentState();
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}